

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertySingleValue::~IfcPropertySingleValue
          (IfcPropertySingleValue *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  *(undefined ***)this = &PTR__IfcPropertySingleValue_00837b50;
  *(undefined ***)&this->field_0xa8 = &PTR__IfcPropertySingleValue_00837bc8;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertySingleValue_00837b78;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPropertySingleValue_00837ba0;
  p_Var1 = (this->Unit).ptr.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySingleValue,_2UL>).
             field_0x18;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  *(undefined8 *)this = 0x837ce0;
  *(undefined8 *)&this->field_0xa8 = 0x837d08;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0xc0);
  return;
}

Assistant:

IfcPropertySingleValue() : Object("IfcPropertySingleValue") {}